

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O0

void __thiscall
RandomWordTestData<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>_>::populate
          (RandomWordTestData<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>_> *this)

{
  bool bVar1;
  result_type rVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  iterator __first;
  iterator __last;
  __normal_iterator<char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_> local_1448;
  const_iterator local_1440;
  char8_t *local_1438;
  char8_t *local_1430;
  __normal_iterator<char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_> local_1428;
  __normal_iterator<char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_> local_1420;
  const_iterator local_1418;
  size_type local_1410 [3];
  vector<char8_t,_std::allocator<char8_t>_> local_13f8;
  vector<char8_t,_std::allocator<char8_t>_> local_13e0;
  ulong local_13c8;
  size_t word_length;
  size_t word_count;
  uniform_int_distribution<unsigned_int> word_length_distribution;
  uniform_int_distribution<unsigned_int> word_count_distribution;
  duration<long,_std::ratio<1L,_1000000000L>_> local_13a0;
  undefined1 local_1398 [8];
  mt19937 randgen;
  RandomWordTestData<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>_> *this_local;
  
  randgen._M_p = (size_t)this;
  std::
  vector<std::vector<char8_t,_std::allocator<char8_t>_>,_std::allocator<std::vector<char8_t,_std::allocator<char8_t>_>_>_>
  ::clear(&this->m_tokens);
  std::vector<char8_t,_std::allocator<char8_t>_>::clear(&this->m_str);
  word_count_distribution._M_param = (param_type)std::chrono::_V2::system_clock::now();
  local_13a0.__r =
       (rep)std::chrono::
            time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&word_count_distribution);
  uVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_13a0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_1398,uVar3 & 0xffffffff);
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution
            (&word_length_distribution,5,0x40);
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_int> *)&word_count,0,0x10);
  word_length = this->m_fixed_word_count;
  if (word_length == 0) {
    rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                      (&word_length_distribution,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)local_1398);
    word_length = (size_t)rVar2;
  }
  while (sVar4 = std::
                 vector<std::vector<char8_t,_std::allocator<char8_t>_>,_std::allocator<std::vector<char8_t,_std::allocator<char8_t>_>_>_>
                 ::size(&this->m_tokens), sVar4 < word_length) {
    local_13c8 = this->m_fixed_word_length;
    if (local_13c8 == 0) {
      rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                        ((uniform_int_distribution<unsigned_int> *)&word_count,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)local_1398);
      local_13c8 = (ulong)rVar2;
    }
    std::vector<char8_t,_std::allocator<char8_t>_>::vector(&local_13f8,&this->m_delim);
    make_word<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>,_std::vector<char8_t,_std::allocator<char8_t>_>,_nullptr>
              (&local_13e0,&local_13f8,local_13c8);
    std::
    vector<std::vector<char8_t,_std::allocator<char8_t>_>,_std::allocator<std::vector<char8_t,_std::allocator<char8_t>_>_>_>
    ::push_back(&this->m_tokens,&local_13e0);
    std::vector<char8_t,_std::allocator<char8_t>_>::~vector(&local_13e0);
    std::vector<char8_t,_std::allocator<char8_t>_>::~vector(&local_13f8);
    pvVar5 = std::
             vector<std::vector<char8_t,_std::allocator<char8_t>_>,_std::allocator<std::vector<char8_t,_std::allocator<char8_t>_>_>_>
             ::back(&this->m_tokens);
    bVar1 = std::vector<char8_t,_std::allocator<char8_t>_>::empty(pvVar5);
    if (bVar1) {
      std::
      vector<std::vector<char8_t,_std::allocator<char8_t>_>,_std::allocator<std::vector<char8_t,_std::allocator<char8_t>_>_>_>
      ::pop_back(&this->m_tokens);
    }
    else {
      local_1410[0] = std::vector<char8_t,_std::allocator<char8_t>_>::size(&this->m_str);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->m_token_indexes,local_1410);
      local_1420._M_current =
           (char8_t *)std::vector<char8_t,_std::allocator<char8_t>_>::end(&this->m_str);
      __gnu_cxx::__normal_iterator<char8_t_const*,std::vector<char8_t,std::allocator<char8_t>>>::
      __normal_iterator<char8_t*>
                ((__normal_iterator<char8_t_const*,std::vector<char8_t,std::allocator<char8_t>>> *)
                 &local_1418,&local_1420);
      pvVar5 = std::
               vector<std::vector<char8_t,_std::allocator<char8_t>_>,_std::allocator<std::vector<char8_t,_std::allocator<char8_t>_>_>_>
               ::back(&this->m_tokens);
      local_1428._M_current =
           (char8_t *)std::vector<char8_t,_std::allocator<char8_t>_>::begin(pvVar5);
      pvVar5 = std::
               vector<std::vector<char8_t,_std::allocator<char8_t>_>,_std::allocator<std::vector<char8_t,_std::allocator<char8_t>_>_>_>
               ::back(&this->m_tokens);
      local_1430 = (char8_t *)std::vector<char8_t,_std::allocator<char8_t>_>::end(pvVar5);
      local_1438 = (char8_t *)
                   std::vector<char8_t,std::allocator<char8_t>>::
                   insert<__gnu_cxx::__normal_iterator<char8_t*,std::vector<char8_t,std::allocator<char8_t>>>,void>
                             ((vector<char8_t,std::allocator<char8_t>> *)&this->m_str,local_1418,
                              local_1428,
                              (__normal_iterator<char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>
                               )local_1430);
    }
    local_1448._M_current =
         (char8_t *)std::vector<char8_t,_std::allocator<char8_t>_>::end(&this->m_str);
    __gnu_cxx::__normal_iterator<char8_t_const*,std::vector<char8_t,std::allocator<char8_t>>>::
    __normal_iterator<char8_t*>
              ((__normal_iterator<char8_t_const*,std::vector<char8_t,std::allocator<char8_t>>> *)
               &local_1440,&local_1448);
    __first = std::vector<char8_t,_std::allocator<char8_t>_>::begin(&this->m_delim);
    __last = std::vector<char8_t,_std::allocator<char8_t>_>::end(&this->m_delim);
    std::vector<char8_t,std::allocator<char8_t>>::
    insert<__gnu_cxx::__normal_iterator<char8_t*,std::vector<char8_t,std::allocator<char8_t>>>,void>
              ((vector<char8_t,std::allocator<char8_t>> *)&this->m_str,local_1440,
               (__normal_iterator<char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>)
               __first._M_current,
               (__normal_iterator<char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>)
               __last._M_current);
  }
  return;
}

Assistant:

void populate() {
		m_tokens.clear();
		m_str.clear();

		std::mt19937 randgen(static_cast<unsigned int>(std::chrono::system_clock::now().time_since_epoch().count()));
		std::uniform_int_distribution<uint32_t> word_count_distribution(5, 64);
		std::uniform_int_distribution<uint32_t> word_length_distribution(0, 16);

		auto word_count = m_fixed_word_count;
		if (word_count == 0) {
			word_count = word_count_distribution(randgen);
		}

		while (m_tokens.size() < word_count) {
			auto word_length = m_fixed_word_length;
			if (word_length == 0) {
				word_length = word_length_distribution(randgen);
			}
			m_tokens.push_back(make_word<T, StringT>(m_delim, word_length));
			if (m_tokens.back().empty()) {
				m_tokens.pop_back();
			}
			else {
				m_token_indexes.push_back(m_str.size());
				m_str.insert(m_str.end(), m_tokens.back().begin(), m_tokens.back().end());
			}
			m_str.insert(m_str.end(), m_delim.begin(), m_delim.end());
		}
	}